

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,float *value)

{
  bool bVar1;
  ostream *poVar2;
  char cVar3;
  parse_options_t<char> in_R8;
  from_chars_result_t<char> fVar4;
  expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  flt;
  string value_str;
  float result;
  float v;
  undefined1 local_200 [32];
  bool local_1e0;
  string local_1d8;
  string local_1b8;
  unexpected_type<const_char_*> local_198 [14];
  ios_base local_128 [264];
  
  bVar1 = MaybeNonFinite<float>(this,(float *)local_198);
  if (bVar1) {
    *value = local_198[0].m_error._0_4_;
    cVar3 = '\x01';
  }
  else {
    local_1d8._M_string_length = 0;
    local_1d8.field_2._M_local_buf[0] = '\0';
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    bVar1 = LexFloat(this,&local_1d8);
    if (bVar1) {
      fVar4 = fast_float::from_chars_advanced<float,char>
                        ((fast_float *)local_1d8._M_dataplus._M_p,
                         local_1d8._M_dataplus._M_p + local_1d8._M_string_length,(char *)&local_1b8,
                         (float *)0x2e00000005,in_R8);
      if (fVar4.ec == 0) {
        local_1e0 = true;
        local_200._0_4_ = local_1b8._M_dataplus._M_p._0_4_;
      }
      else {
        local_198[0].m_error = "Parse failed.";
        nonstd::expected_lite::
        expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<const_char_*,_0>
                  ((expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_200,local_198);
      }
      cVar3 = local_1e0;
      if (local_1e0 == true) {
        *value = (float)local_200._0_4_;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                   ,0x5f);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,"ReadBasicType",0xd);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
        poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)local_198,0xb12);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,"Failed to parse floating value.",0x1f);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1b8._M_dataplus._M_p._4_4_,local_1b8._M_dataplus._M_p._0_4_) !=
            &local_1b8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_1b8._M_dataplus._M_p._4_4_,local_1b8._M_dataplus._M_p._0_4_
                                  ),local_1b8.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
        ::std::ios_base::~ios_base(local_128);
      }
      if ((local_1e0 == false) &&
         ((undefined1 *)CONCAT44(local_200._4_4_,local_200._0_4_) != local_200 + 0x10)) {
        operator_delete((undefined1 *)CONCAT44(local_200._4_4_,local_200._0_4_),local_200._16_8_ + 1
                       );
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                 ,0x5f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"ReadBasicType",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
      poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)local_198,0xb0b);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Failed to lex floating value literal.",0x25);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)local_200);
      if ((undefined1 *)CONCAT44(local_200._4_4_,local_200._0_4_) != local_200 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_200._4_4_,local_200._0_4_),local_200._16_8_ + 1
                       );
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      ::std::ios_base::~ios_base(local_128);
      cVar3 = '\0';
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,
                      CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                               local_1d8.field_2._M_local_buf[0]) + 1);
    }
  }
  return (bool)cVar3;
}

Assistant:

bool AsciiParser::ReadBasicType(float *value) {
  // -inf, inf, nan
  {
    float v;
    if (MaybeNonFinite(&v)) {
      (*value) = v;
      return true;
    }
  }

  std::string value_str;
  if (!LexFloat(&value_str)) {
    PUSH_ERROR_AND_RETURN("Failed to lex floating value literal.");
  }

  auto flt = ParseFloat(value_str);
  if (flt) {
    (*value) = flt.value();
  } else {
    PUSH_ERROR_AND_RETURN("Failed to parse floating value.");
  }

  return true;
}